

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void extend_lines(uint8_t *buf,int width,int height,int stride,int extend,int use_highbitdepth)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ushort *in_RDI;
  int in_R8D;
  int in_R9D;
  uint16_t *buf16;
  int i;
  int local_20;
  ushort *local_8;
  
  local_8 = in_RDI;
  for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
    if (in_R9D == 0) {
      memset((void *)((long)local_8 - (long)in_R8D),(uint)(byte)*local_8,(long)in_R8D);
      memset((byte *)((long)local_8 + (long)in_ESI),
             (uint)*(byte *)((long)local_8 + (long)(in_ESI + -1)),(long)in_R8D);
    }
    else {
      aom_memset16(local_8 + -(long)in_R8D,(uint)*local_8,(long)in_R8D);
      aom_memset16(local_8 + in_ESI,(uint)local_8[in_ESI + -1],(long)in_R8D);
    }
    local_8 = (ushort *)((long)local_8 + (long)in_ECX);
  }
  return;
}

Assistant:

static void extend_lines(uint8_t *buf, int width, int height, int stride,
                         int extend, int use_highbitdepth) {
  for (int i = 0; i < height; ++i) {
    if (use_highbitdepth) {
      uint16_t *buf16 = (uint16_t *)buf;
      aom_memset16(buf16 - extend, buf16[0], extend);
      aom_memset16(buf16 + width, buf16[width - 1], extend);
    } else {
      memset(buf - extend, buf[0], extend);
      memset(buf + width, buf[width - 1], extend);
    }
    buf += stride;
  }
}